

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_functionBytecodeAssembler_caseJump
          (sysbvm_context_t *context,sysbvm_functionBytecodeAssembler_t *assembler,
          sysbvm_tuple_t value,sysbvm_tuple_t caseKeys,sysbvm_tuple_t caseDestinations,
          sysbvm_tuple_t defaultDestination)

{
  uint uVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t *psVar3;
  ulong uVar4;
  sysbvm_tuple_t sVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  
  bVar7 = (caseKeys & 0xf) != 0;
  if (bVar7 || caseKeys == 0) {
    uVar6 = 0;
  }
  else {
    uVar6 = (ulong)(*(uint *)(caseKeys + 0xc) >> 3);
  }
  bVar8 = (caseDestinations & 0xf) != 0;
  if (bVar8 || caseDestinations == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(uint *)(caseDestinations + 0xc) >> 3;
  }
  if ((uint)uVar6 != uVar1) {
    sysbvm_error_assertionFailure
              (
              "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/bytecodeCompiler.c:576: assertion failure: caseCount == sysbvm_array_getSize(caseDestinations)"
              );
  }
  sysbvm_functionBytecodeAssembler_countExtension(context,assembler,uVar6 >> 4);
  sVar2 = sysbvm_array_create(context,uVar6 * 2 + 2);
  bVar9 = sVar2 != 0;
  bVar10 = (sVar2 & 0xf) == 0;
  if (bVar10 && bVar9) {
    *(sysbvm_tuple_t *)(sVar2 + 0x10) = value;
  }
  psVar3 = (sysbvm_tuple_t *)(sVar2 + 0x18);
  for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    if (bVar7 || caseKeys == 0) {
      sVar5 = 0;
    }
    else {
      sVar5 = *(sysbvm_tuple_t *)(caseKeys + 0x10 + uVar4 * 8);
    }
    if (bVar10 && bVar9) {
      *psVar3 = sVar5;
    }
    psVar3 = psVar3 + 1;
  }
  for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    if (bVar8 || caseDestinations == 0) {
      sVar5 = 0;
    }
    else {
      sVar5 = *(sysbvm_tuple_t *)(caseDestinations + 0x10 + uVar4 * 8);
    }
    if (bVar10 && bVar9) {
      *psVar3 = sVar5;
    }
    psVar3 = psVar3 + 1;
  }
  if (bVar10 && bVar9) {
    *psVar3 = defaultDestination;
  }
  sVar2 = sysbvm_functionBytecodeAssemblerInstruction_create(context,0xe0,sVar2);
  sysbvm_functionBytecodeAssembler_addInstruction(assembler,sVar2);
  return sVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionBytecodeAssembler_caseJump(sysbvm_context_t *context, sysbvm_functionBytecodeAssembler_t *assembler, sysbvm_tuple_t value, sysbvm_tuple_t caseKeys, sysbvm_tuple_t caseDestinations, sysbvm_tuple_t defaultDestination)
{
    size_t caseCount = sysbvm_array_getSize(caseKeys);
    SYSBVM_ASSERT(caseCount == sysbvm_array_getSize(caseDestinations));

    sysbvm_functionBytecodeAssembler_countExtension(context, assembler, caseCount>>4);

    sysbvm_tuple_t operands = sysbvm_array_create(context, 1 + caseCount + caseCount + 1);
    size_t operandIndex = 0;
    sysbvm_array_atPut(operands, operandIndex++, value);
    for(size_t i = 0; i < caseCount; ++i)
        sysbvm_array_atPut(operands, operandIndex++, sysbvm_array_at(caseKeys, i));
    for(size_t i = 0; i < caseCount; ++i)
        sysbvm_array_atPut(operands, operandIndex++, sysbvm_array_at(caseDestinations, i));
    sysbvm_array_atPut(operands, operandIndex++, defaultDestination);

    sysbvm_tuple_t instruction = sysbvm_functionBytecodeAssemblerInstruction_create(context, SYSBVM_OPCODE_CASE_JUMP, operands);
    sysbvm_functionBytecodeAssembler_addInstruction(assembler, instruction);
    return instruction;
}